

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O0

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)

{
  long *in_RDI;
  uchar *ipad;
  int ret;
  mbedtls_md_context_t *in_stack_ffffffffffffffd8;
  uchar *input;
  uint in_stack_ffffffffffffffe8;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RDI[2] == 0)) {
    local_4 = -0x5100;
  }
  else {
    input = (uchar *)in_RDI[2];
    local_4 = mbedtls_md_starts(in_stack_ffffffffffffffd8);
    if (local_4 == 0) {
      local_4 = mbedtls_md_update((mbedtls_md_context_t *)(ulong)in_stack_ffffffffffffffe8,input,
                                  (size_t)in_stack_ffffffffffffffd8);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *ipad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;

    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        return ret;
    }
    return mbedtls_md_update(ctx, ipad, ctx->md_info->block_size);
}